

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_frameHeaderSize_internal(void *src,size_t srcSize,ZSTD_format_e format)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  
  lVar1 = (ulong)(format == ZSTD_f_zstd1) * 4;
  uVar2 = lVar1 + 1;
  if (srcSize < uVar2) {
    return 0xffffffffffffffb8;
  }
  bVar3 = *(byte *)((long)src + lVar1);
  return uVar2 + ZSTD_did_fieldSize[bVar3 & 3] +
         *(long *)((long)ZSTD_fcs_fieldSize + (ulong)(bVar3 >> 3 & 0x18)) +
         (ulong)((bVar3 & 0x20) == 0) + (ulong)(bVar3 < 0x40 & (byte)((bVar3 & 0x20) >> 5));
}

Assistant:

static size_t ZSTD_frameHeaderSize_internal(const void* src, size_t srcSize, ZSTD_format_e format)
{
    size_t const minInputSize = ZSTD_startingInputLength(format);
    RETURN_ERROR_IF(srcSize < minInputSize, srcSize_wrong, "");

    {   BYTE const fhd = ((const BYTE*)src)[minInputSize-1];
        U32 const dictID= fhd & 3;
        U32 const singleSegment = (fhd >> 5) & 1;
        U32 const fcsId = fhd >> 6;
        return minInputSize + !singleSegment
             + ZSTD_did_fieldSize[dictID] + ZSTD_fcs_fieldSize[fcsId]
             + (singleSegment && !fcsId);
    }
}